

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall UtestShellPointerArray::reverse(UtestShellPointerArray *this)

{
  ulong uVar1;
  size_t j;
  size_t i;
  size_t halfCount;
  UtestShellPointerArray *this_local;
  
  if (this->count_ != 0) {
    uVar1 = this->count_;
    for (j = 0; j < uVar1 >> 1; j = j + 1) {
      swap(this,j,(this->count_ - j) - 1);
    }
    relinkTestsInOrder(this);
  }
  return;
}

Assistant:

void UtestShellPointerArray::reverse()
{
    if (count_ == 0) return;

    size_t halfCount = count_ / 2;
    for (size_t i = 0; i < halfCount; i++)
    {
        size_t j = count_ - i - 1;
        swap(i, j);
   }
   relinkTestsInOrder();
}